

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexReaderCache::PtexReaderCache
          (PtexReaderCache *this,int maxFiles,size_t maxMem,bool premultiply,
          PtexInputHandler *inputHandler,PtexErrorHandler *errorHandler)

{
  byte in_CL;
  pointer in_RDX;
  int in_ESI;
  PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *in_RDI;
  pointer in_R8;
  pointer in_R9;
  
  PtexCache::PtexCache((PtexCache *)in_RDI);
  in_RDI->_entries = (Entry *)&PTR__PtexReaderCache_03803538;
  in_RDI->_numEntries = (int)(long)in_ESI;
  in_RDI->_size = (int)((ulong)(long)in_ESI >> 0x20);
  (in_RDI->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RDX;
  (in_RDI->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_R8;
  (in_RDI->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_R9;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xaa6b47);
  PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::PtexHashMap(in_RDI);
  *(byte *)&in_RDI[3]._oldEntries.
            super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_start = in_CL & 1;
  in_RDI[3]._oldEntries.
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4d0;
  in_RDI[5]._numEntries = 0;
  in_RDI[5]._size = 0;
  Mutex::Mutex((Mutex *)0xaa6b93);
  in_RDI[0x1c]._oldEntries.
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&in_RDI[8]._oldEntries;
  in_RDI[0x1d]._entries =
       (Entry *)&in_RDI[0x12]._oldEntries.
                 super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_openFilesItem>::
  PtexLruList((PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_openFilesItem>
               *)0xaa6bc6);
  PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>::
  PtexLruList((PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>
               *)0xaa6bd9);
  in_RDI[0x1e]._entries = (Entry *)0x0;
  in_RDI[0x1e]._numEntries = 0;
  in_RDI[0x1e]._size = 0;
  in_RDI[0x1e]._oldEntries.
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[0x1e]._oldEntries.
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&in_RDI[8]._oldEntries,0,0x330);
  memset(&in_RDI[3]._oldEntries.
          super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x38);
  memset(&in_RDI[5]._oldEntries,0,0x38);
  memset(&in_RDI[7]._oldEntries.
          super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
  return;
}

Assistant:

PtexReaderCache(int maxFiles, size_t maxMem, bool premultiply, PtexInputHandler* inputHandler, PtexErrorHandler* errorHandler)
        : _maxFiles(maxFiles), _maxMem(maxMem), _io(inputHandler), _err(errorHandler), _premultiply(premultiply),
          _memUsed(sizeof(*this)), _filesOpen(0), _mruList(&_mruLists[0]), _prevMruList(&_mruLists[1]),
          _peakMemUsed(0), _peakFilesOpen(0), _fileOpens(0), _blockReads(0)
    {
        memset((void*)&_mruLists[0], 0, sizeof(_mruLists));
        CACHE_LINE_PAD_INIT(_memUsed); // keep cppcheck happy
        CACHE_LINE_PAD_INIT(_filesOpen);
        CACHE_LINE_PAD_INIT(_mruLock);
    }